

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_loaded_list_tests.cpp
# Opt level: O3

void __thiscall
omp_make_loaded_list_many_elements_test_Test::~omp_make_loaded_list_many_elements_test_Test
          (omp_make_loaded_list_many_elements_test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(omp_make_loaded_list, many_elements_test) {
  auto mock = std::make_shared<TestMock>();

  EXPECT_CALL(*mock.get(), LoadDataList);

  EXPECT_CALL(*mock.get(), Count)
      .WillRepeatedly(DoAll(SetArgPointee<0>(10), Return(true)));

  EXPECT_CALL(*mock.get(), GetRecordByIndex)
      .WillRepeatedly([](long index, TestValue *value) {
        value->dummy = index + 1;
        return true;
      });

  auto list = omp::make_loaded_list(mock);

  const std::vector expecting = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10};

  ASSERT_TRUE(std::equal(std::cbegin(list), std::cend(list),
                         std::cbegin(expecting), std::cend(expecting),
                         [](auto &f, auto &s) { return f.dummy == s; }));
}